

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow *window)

{
  float *pfVar1;
  float fVar2;
  undefined1 auVar3 [16];
  float fVar4;
  ImVec2 IVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  fVar8 = (window->Scroll).x;
  fVar9 = (window->Scroll).y;
  fVar7 = (window->ScrollTarget).x;
  if (fVar7 < 3.4028235e+38) {
    fVar8 = (window->ScrollTargetCenterRatio).x;
    fVar2 = (window->ScrollTargetEdgeSnapDist).x;
    if (0.0 < fVar2) {
      if (fVar7 <= fVar2) {
        fVar7 = fVar7 * fVar8 + 0.0;
      }
      else {
        fVar10 = (window->ScrollMax).x + (window->Size).x;
        if (fVar10 - fVar2 <= fVar7) {
          fVar7 = fVar7 + (fVar10 - fVar7) * fVar8;
        }
      }
    }
    fVar8 = fVar7 - fVar8 * ((window->SizeFull).x - (window->ScrollbarSizes).x);
  }
  pfVar1 = &(window->ScrollTarget).y;
  if (*pfVar1 <= 3.4028235e+38 && *pfVar1 != 3.4028235e+38) {
    fVar10 = ImGuiWindow::TitleBarHeight(window);
    fVar4 = ImGuiWindow::MenuBarHeight(window);
    fVar9 = (window->ScrollTarget).y;
    fVar7 = (window->ScrollTargetCenterRatio).y;
    fVar2 = (window->ScrollTargetEdgeSnapDist).y;
    if (0.0 < fVar2) {
      if (fVar9 <= fVar2) {
        fVar9 = fVar9 * fVar7 + 0.0;
      }
      else {
        fVar11 = ((window->ScrollMax).y + (window->Size).y) - (fVar4 + fVar10);
        if (fVar11 - fVar2 <= fVar9) {
          fVar9 = fVar9 + (fVar11 - fVar9) * fVar7;
        }
      }
    }
    fVar9 = fVar9 - fVar7 * (((window->SizeFull).y - (window->ScrollbarSizes).y) - (fVar4 + fVar10))
    ;
  }
  IVar5.x = (float)(int)(float)(-(uint)(0.0 <= fVar8) & (uint)fVar8);
  IVar5.y = (float)(int)(float)(-(uint)(0.0 <= fVar9) & (uint)fVar9);
  auVar6._8_8_ = 0;
  auVar6._0_4_ = IVar5.x;
  auVar6._4_4_ = IVar5.y;
  if ((window->Collapsed == false) && (window->SkipItems == false)) {
    auVar3._8_8_ = 0;
    auVar3._0_4_ = (window->ScrollMax).x;
    auVar3._4_4_ = (window->ScrollMax).y;
    auVar6 = minps(auVar6,auVar3);
    IVar5 = auVar6._0_8_;
  }
  return IVar5;
}

Assistant:

static ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow* window)
{
    ImVec2 scroll = window->Scroll;
    if (window->ScrollTarget.x < FLT_MAX)
    {
        float center_x_ratio = window->ScrollTargetCenterRatio.x;
        float scroll_target_x = window->ScrollTarget.x;
        float snap_x_min = 0.0f;
        float snap_x_max = window->ScrollMax.x + window->Size.x;
        if (window->ScrollTargetEdgeSnapDist.x > 0.0f)
            scroll_target_x = CalcScrollEdgeSnap(scroll_target_x, snap_x_min, snap_x_max, window->ScrollTargetEdgeSnapDist.x, center_x_ratio);
        scroll.x = scroll_target_x - center_x_ratio * (window->SizeFull.x - window->ScrollbarSizes.x);
    }
    if (window->ScrollTarget.y < FLT_MAX)
    {
        float decoration_up_height = window->TitleBarHeight() + window->MenuBarHeight();
        float center_y_ratio = window->ScrollTargetCenterRatio.y;
        float scroll_target_y = window->ScrollTarget.y;
        float snap_y_min = 0.0f;
        float snap_y_max = window->ScrollMax.y + window->Size.y - decoration_up_height;
        if (window->ScrollTargetEdgeSnapDist.y > 0.0f)
            scroll_target_y = CalcScrollEdgeSnap(scroll_target_y, snap_y_min, snap_y_max, window->ScrollTargetEdgeSnapDist.y, center_y_ratio);
        scroll.y = scroll_target_y - center_y_ratio * (window->SizeFull.y - window->ScrollbarSizes.y - decoration_up_height);
    }
    scroll.x = IM_FLOOR(ImMax(scroll.x, 0.0f));
    scroll.y = IM_FLOOR(ImMax(scroll.y, 0.0f));
    if (!window->Collapsed && !window->SkipItems)
    {
        scroll.x = ImMin(scroll.x, window->ScrollMax.x);
        scroll.y = ImMin(scroll.y, window->ScrollMax.y);
    }
    return scroll;
}